

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

uint32 google::protobuf::compiler::cpp::anon_unknown_0::GenChunkMask
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *fields,vector<int,_std::allocator<int>_> *has_bit_indices)

{
  int iVar1;
  uint uVar2;
  FieldDescriptor *pFVar3;
  pointer ppFVar4;
  LogMessage *pLVar5;
  long *plVar6;
  uint uVar7;
  vector<int,_std::allocator<int>_> *pvVar8;
  int iVar9;
  const_iterator __begin3;
  pointer ppFVar10;
  uint uVar11;
  LogFinisher local_e5;
  uint local_e4;
  vector<int,_std::allocator<int>_> *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_e0 = has_bit_indices;
  if ((fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (fields->
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x1cc);
    pLVar5 = internal::LogMessage::operator<<(&local_68,"CHECK failed: !fields.empty(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar5);
    internal::LogMessage::~LogMessage(&local_68);
  }
  ppFVar10 = (fields->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  pFVar3 = *ppFVar10;
  if (pFVar3[0x42] == (FieldDescriptor)0x0) {
    plVar6 = (long *)(*(long *)(pFVar3 + 0x50) + 0x28);
  }
  else if (*(long *)(pFVar3 + 0x60) == 0) {
    plVar6 = (long *)(*(long *)(pFVar3 + 0x28) + 0x80);
  }
  else {
    plVar6 = (long *)(*(long *)(pFVar3 + 0x60) + 0x50);
  }
  iVar1 = (local_e0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[(int)((ulong)((long)pFVar3 - *plVar6) >> 3) * 0x286bca1b];
  iVar9 = iVar1 + 0x1f;
  if (-1 < iVar1) {
    iVar9 = iVar1;
  }
  ppFVar4 = (fields->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar10 == ppFVar4) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    pvVar8 = local_e0;
    do {
      pFVar3 = *ppFVar10;
      if (pFVar3[0x42] == (FieldDescriptor)0x0) {
        plVar6 = (long *)(*(long *)(pFVar3 + 0x50) + 0x28);
      }
      else if (*(long *)(pFVar3 + 0x60) == 0) {
        plVar6 = (long *)(*(long *)(pFVar3 + 0x28) + 0x80);
      }
      else {
        plVar6 = (long *)(*(long *)(pFVar3 + 0x60) + 0x50);
      }
      uVar2 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)((ulong)((long)pFVar3 - *plVar6) >> 3) * 0x286bca1b];
      uVar11 = uVar2 + 0x1f;
      if (-1 < (int)uVar2) {
        uVar11 = uVar2;
      }
      if (iVar9 >> 5 != (int)uVar11 >> 5) {
        local_e4 = uVar7;
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                   ,0x1d2);
        pLVar5 = internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: (first_index_offset) == (index / 32): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar5);
        internal::LogMessage::~LogMessage(&local_a0);
        pvVar8 = local_e0;
        uVar7 = local_e4;
      }
      uVar7 = uVar7 | 1 << (uVar2 & 0x1f);
      ppFVar10 = ppFVar10 + 1;
    } while (ppFVar10 != ppFVar4);
  }
  if (uVar7 == 0) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
               ,0x1d5);
    pLVar5 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: (0) != (chunk_mask): ");
    internal::LogFinisher::operator=(&local_e5,pLVar5);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  return uVar7;
}

Assistant:

uint32 GenChunkMask(const std::vector<const FieldDescriptor*>& fields,
                    const std::vector<int>& has_bit_indices) {
  GOOGLE_CHECK(!fields.empty());
  int first_index_offset = has_bit_indices[fields.front()->index()] / 32;
  uint32 chunk_mask = 0;
  for (auto field : fields) {
    // "index" defines where in the _has_bits_ the field appears.
    int index = has_bit_indices[field->index()];
    GOOGLE_CHECK_EQ(first_index_offset, index / 32);
    chunk_mask |= static_cast<uint32>(1) << (index % 32);
  }
  GOOGLE_CHECK_NE(0, chunk_mask);
  return chunk_mask;
}